

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_act(void)

{
  int local_c;
  wchar_t idx;
  
  for (local_c = 0; local_c < (int)(uint)z_info->act_max; local_c = local_c + 1) {
    string_free(activations[local_c].name);
    mem_free(activations[local_c].desc);
    mem_free(activations[local_c].message);
    free_effect(activations[local_c].effect);
  }
  mem_free(activations);
  return;
}

Assistant:

static void cleanup_act(void)
{
	int idx;
	for (idx = 0; idx < z_info->act_max; idx++) {
		string_free(activations[idx].name);
		mem_free(activations[idx].desc);
		mem_free(activations[idx].message);
		free_effect(activations[idx].effect);
	}
	mem_free(activations);
}